

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_property.c
# Opt level: O3

int mpt_logfile_set(mpt_logfile *log,char *name,mpt_convertable *src)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  uint8_t val;
  char *ign;
  uint8_t local_29;
  char *local_28;
  
  if (name == (char *)0x0) {
LAB_00118527:
    iVar3 = setHistfile(log,src);
    return iVar3;
  }
  iVar3 = -1;
  if (*name != '\0') {
    iVar2 = strcasecmp(name,"file");
    if (iVar2 == 0) goto LAB_00118527;
    iVar2 = strcasecmp(name,"ignore");
    if (iVar2 == 0) {
      if (src == (mpt_convertable *)0x0) {
        iVar3 = 0;
        local_29 = '\b';
      }
      else {
        iVar2 = (*src->_vptr->convert)(src,0x79,&local_29);
        iVar3 = -2;
        if (iVar2 < 0) {
          return -2;
        }
      }
      log->ignore = local_29;
    }
    else {
      iVar2 = strcasecmp(name,"level");
      if (iVar2 == 0) {
        local_28 = (char *)0x0;
        if (src == (mpt_convertable *)0x0) {
          iVar3 = 0;
          uVar1 = '\b';
        }
        else {
          iVar3 = (*src->_vptr->convert)(src,0x73,&local_28);
          if (iVar3 < 0) {
            return iVar3;
          }
          iVar2 = mpt_log_level(local_28);
          if (iVar2 < 0) {
            return iVar2;
          }
          uVar1 = (char)iVar2 + '\x01';
        }
        log->ignore = uVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

extern int mpt_logfile_set(MPT_STRUCT(logfile) *log, const char *name, MPT_INTERFACE(convertable) *src)
{
	int ret;
	if (!name) {
		return setHistfile(log, src);
	}
	if (!*name) {
		return MPT_ERROR(BadArgument);
	}
	if (!strcasecmp(name, "file")) {
		return setHistfile(log, src);
	}
	if (!strcasecmp(name, "ignore")) {
		uint8_t val;
		if (!src) {
			log->ignore = MPT_LOG(Info);
			return 0;
		}
		if ((ret = src->_vptr->convert(src, 'y', &val)) >= 0) {
			log->ignore = val;
		}
		return MPT_ERROR(BadValue);
	}
	if (!strcasecmp(name, "level")) {
		const char *ign = 0;
		if (!src) {
			log->ignore = MPT_LOG(Info);
			return 0;
		}
		if ((ret = src->_vptr->convert(src, 's', &ign)) >= 0) {
			int lv = mpt_log_level(ign);
			if (lv < 0) {
				return lv;
			}
			log->ignore = lv + 1;
		}
		return ret;
	}
	return MPT_ERROR(BadArgument);
}